

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalException.cpp
# Opt level: O1

string * __thiscall
ApprovalTests::ApprovalMissingException::format
          (string *__return_storage_ptr__,ApprovalMissingException *this,string *file)

{
  ostream *poVar1;
  stringstream s;
  char local_1a1;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190,"Failed Approval: \n",0x12);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190,"Approval File Not Found \n",0x19);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190,"File: \"",7);
  poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,(file->_M_dataplus)._M_p,file->_M_string_length);
  local_1a1 = '\"';
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1a1,1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  ::std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string ApprovalMissingException::format(const std::string& file)
    {
        std::stringstream s;
        s << "Failed Approval: \n"
          << "Approval File Not Found \n"
          << "File: \"" << file << '"';
        return s.str();
    }